

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void __thiscall OpenSteer::DrawSphereHelper::draw(DrawSphereHelper *this)

{
  long in_RDI;
  Vec3 VVar1;
  Vec3 v12;
  Vec3 v11;
  Vec3 v10;
  Vec3 v9;
  Vec3 v8;
  Vec3 v7;
  Vec3 v6;
  Vec3 v5;
  Vec3 v4;
  Vec3 v3;
  Vec3 v2;
  Vec3 v1;
  float b;
  float a;
  float ratio;
  float phi;
  float sqrt5;
  Vec3 *in_stack_fffffffffffffcf8;
  Vec3 *this_00;
  Vec3 *in_stack_fffffffffffffd00;
  Vec3 *this_01;
  float fVar2;
  undefined4 in_stack_fffffffffffffdbc;
  Vec3 *in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc8;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 local_228;
  float local_220;
  Vec3 local_214;
  undefined8 local_208;
  float local_200;
  Vec3 local_1f8;
  Vec3 local_1e4;
  undefined8 local_1d8;
  float local_1d0;
  Vec3 local_1c8;
  Vec3 local_1b4;
  undefined8 local_1a8;
  float local_1a0;
  Vec3 local_198;
  Vec3 local_184;
  undefined8 local_178;
  float local_170;
  Vec3 local_168;
  Vec3 local_154;
  undefined8 local_148;
  float local_140;
  Vec3 local_138;
  Vec3 local_124;
  Vec3 local_118;
  Vec3 local_108;
  Vec3 local_f4;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  Vec3 local_c4;
  undefined8 local_b8;
  float local_b0;
  Vec3 local_a8;
  Vec3 local_94;
  Vec3 local_88;
  Vec3 local_78;
  Vec3 local_64;
  undefined8 local_58;
  float local_50;
  Vec3 local_48;
  Vec3 local_34;
  undefined8 local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_c = sqrtXXX(0.0);
  local_10 = (local_c + 1.0) * 0.5;
  local_14 = sqrtXXX(0.0);
  local_14 = local_14 / (local_10 * 4.0);
  local_18 = (*(float *)(in_RDI + 0xc) / local_14) * 0.5;
  local_1c = (*(float *)(in_RDI + 0xc) / local_14) / (local_10 + local_10);
  Vec3::Vec3(&local_34,0.0,local_1c,-local_18);
  VVar1 = Vec3::operator+(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_48.z = VVar1.z;
  local_20 = local_48.z;
  local_48._0_8_ = VVar1._0_8_;
  local_28._0_4_ = local_48.x;
  local_28._4_4_ = local_48.y;
  this_00 = &local_64;
  local_48 = VVar1;
  Vec3::Vec3(this_00,local_1c,local_18,0.0);
  VVar1 = Vec3::operator+(in_stack_fffffffffffffd00,this_00);
  local_78.z = VVar1.z;
  local_50 = local_78.z;
  local_78._0_8_ = VVar1._0_8_;
  local_58._0_4_ = local_78.x;
  local_58._4_4_ = local_78.y;
  this_01 = &local_94;
  local_78 = VVar1;
  Vec3::Vec3(this_01,-local_1c,local_18,0.0);
  local_a8 = Vec3::operator+(this_01,this_00);
  local_88 = local_a8;
  Vec3::Vec3(&local_c4,0.0,local_1c,local_18);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_d0 = VVar1.z;
  local_d8 = VVar1._0_8_;
  local_b8 = local_d8;
  local_b0 = local_d0;
  Vec3::Vec3(&local_f4,0.0,-local_1c,local_18);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_108.z = VVar1.z;
  local_e0 = local_108.z;
  local_108._0_8_ = VVar1._0_8_;
  local_e8._0_4_ = local_108.x;
  local_e8._4_4_ = local_108.y;
  local_108 = VVar1;
  Vec3::Vec3(&local_124,-local_18,0.0,local_1c);
  local_138 = Vec3::operator+(this_01,this_00);
  local_118 = local_138;
  Vec3::Vec3(&local_154,0.0,-local_1c,-local_18);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_168.z = VVar1.z;
  local_140 = local_168.z;
  local_168._0_8_ = VVar1._0_8_;
  local_148._0_4_ = local_168.x;
  local_148._4_4_ = local_168.y;
  local_168 = VVar1;
  Vec3::Vec3(&local_184,local_18,0.0,-local_1c);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_198.z = VVar1.z;
  local_170 = local_198.z;
  local_198._0_8_ = VVar1._0_8_;
  local_178._0_4_ = local_198.x;
  local_178._4_4_ = local_198.y;
  local_198 = VVar1;
  Vec3::Vec3(&local_1b4,local_18,0.0,local_1c);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_1c8.z = VVar1.z;
  local_1a0 = local_1c8.z;
  local_1c8._0_8_ = VVar1._0_8_;
  local_1a8._0_4_ = local_1c8.x;
  local_1a8._4_4_ = local_1c8.y;
  local_1c8 = VVar1;
  Vec3::Vec3(&local_1e4,-local_18,0.0,-local_1c);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_1f8.z = VVar1.z;
  local_1d0 = local_1f8.z;
  local_1f8._0_8_ = VVar1._0_8_;
  local_1d8._0_4_ = local_1f8.x;
  local_1d8._4_4_ = local_1f8.y;
  local_1f8 = VVar1;
  Vec3::Vec3(&local_214,local_1c,-local_18,0.0);
  VVar1 = Vec3::operator+(this_01,this_00);
  local_220 = VVar1.z;
  local_200 = local_220;
  local_228 = VVar1._0_8_;
  local_208 = local_228;
  Vec3::Vec3((Vec3 *)&stack0xfffffffffffffdc0,-local_1c,-local_18,0.0);
  VVar1 = Vec3::operator+(this_01,this_00);
  fVar2 = VVar1.z;
  fVar3 = VVar1.x;
  fVar4 = VVar1.y;
  fVar5 = fVar2;
  drawMeshedTriangleOnSphere
            (VVar1._4_8_,(Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0
             ,(Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  drawMeshedTriangleOnSphere
            ((DrawSphereHelper *)CONCAT44(fVar5,fVar4),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0,
             (Vec3 *)CONCAT44(in_stack_fffffffffffffdbc,fVar2));
  return;
}

Assistant:

void draw (void) const
        {
            // Geometry based on Paul Bourke's excellent article:
            //   Platonic Solids (Regular polytopes in 3D)
            //   http://astronomy.swin.edu.au/~pbourke/polyhedra/platonic/
            const float sqrt5 = sqrtXXX (5.0f);
            const float phi = (1.0f + sqrt5) * 0.5f; // "golden ratio"
            // ratio of edge length to radius
            const float ratio = sqrtXXX (10.0f + (2.0f * sqrt5)) / (4.0f * phi);
            const float a = (radius / ratio) * 0.5f;
            const float b = (radius / ratio) / (2.0f * phi);

            // define the icosahedron's 12 vertices:
            const Vec3 v1  = center + Vec3 ( 0,  b, -a);
            const Vec3 v2  = center + Vec3 ( b,  a,  0);
            const Vec3 v3  = center + Vec3 (-b,  a,  0);
            const Vec3 v4  = center + Vec3 ( 0,  b,  a);
            const Vec3 v5  = center + Vec3 ( 0, -b,  a);
            const Vec3 v6  = center + Vec3 (-a,  0,  b);
            const Vec3 v7  = center + Vec3 ( 0, -b, -a);
            const Vec3 v8  = center + Vec3 ( a,  0, -b);
            const Vec3 v9  = center + Vec3 ( a,  0,  b);
            const Vec3 v10 = center + Vec3 (-a,  0, -b);
            const Vec3 v11 = center + Vec3 ( b, -a,  0);
            const Vec3 v12 = center + Vec3 (-b, -a,  0);

            // draw the icosahedron's 20 triangular faces:
            drawMeshedTriangleOnSphere (v1, v2, v3);
            drawMeshedTriangleOnSphere (v4, v3, v2);
            drawMeshedTriangleOnSphere (v4, v5, v6);
            drawMeshedTriangleOnSphere (v4, v9, v5);
            drawMeshedTriangleOnSphere (v1, v7, v8);
            drawMeshedTriangleOnSphere (v1, v10, v7);
            drawMeshedTriangleOnSphere (v5, v11, v12);
            drawMeshedTriangleOnSphere (v7, v12, v11);
            drawMeshedTriangleOnSphere (v3, v6, v10);
            drawMeshedTriangleOnSphere (v12, v10, v6);
            drawMeshedTriangleOnSphere (v2, v8, v9);
            drawMeshedTriangleOnSphere (v11, v9, v8);
            drawMeshedTriangleOnSphere (v4, v6, v3);
            drawMeshedTriangleOnSphere (v4, v2, v9);
            drawMeshedTriangleOnSphere (v1, v3, v10);
            drawMeshedTriangleOnSphere (v1, v8, v2);
            drawMeshedTriangleOnSphere (v7, v10, v12);
            drawMeshedTriangleOnSphere (v7, v11, v8);
            drawMeshedTriangleOnSphere (v5, v12, v6);
            drawMeshedTriangleOnSphere (v5, v9, v11);
        }